

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arealight.hpp
# Opt level: O2

void uploadLH(int n_vert,float *buffer)

{
  float *data;
  ulong uVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  ulong uVar5;
  
  data = (float *)operator_new__(0x38400000);
  uVar1 = 0;
  pfVar2 = data;
  uVar5 = (ulong)(uint)n_vert;
  if (n_vert < 1) {
    uVar5 = uVar1;
  }
  for (; uVar1 != uVar5; uVar1 = uVar1 + 1) {
    pfVar3 = pfVar2;
    for (lVar4 = 0; lVar4 != 0xe1; lVar4 = lVar4 + 1) {
      *pfVar3 = buffer[lVar4];
      pfVar3 = pfVar3 + 0x100000;
    }
    buffer = buffer + 0xe1;
    pfVar2 = pfVar2 + 1;
  }
  (*glad_glActiveTexture)(0x84c8);
  create_2D_float_texture_array(0x400,0x400,1,0xe1,data,0x2600,false);
  operator_delete__(data);
  return;
}

Assistant:

void uploadLH(int n_vert, const float* buffer)
{
	float* texdata = new float[1024 * 1024 * N_COEFFS];
	for (int i=0; i<n_vert; ++i)
		for (int j=0; j<N_COEFFS; ++j)
			texdata[j*1024*1024+i] = buffer[i*N_COEFFS+j];
	glActiveTexture(GL_TEXTURE8);
	create_2D_float_texture_array(1024, 1024, 1, N_COEFFS, texdata, GL_NEAREST);
	delete[] texdata;
}